

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O2

int xSAT_SolverSimplify(xSAT_Solver_t *s)

{
  iword *piVar1;
  uint uVar2;
  Vec_Int_t *p;
  long lVar3;
  char cVar4;
  uint uVar5;
  xSAT_WatchList_t *pxVar6;
  int i;
  long lVar7;
  xSAT_VecWatchList_t *v;
  uint *puVar8;
  int iVar9;
  int i_00;
  
  if (s->vTrailLim->nSize != 0) {
    __assert_fail("xSAT_SolverDecisionLevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/xsat/xsatSolverAPI.c"
                  ,0xa8,"int xSAT_SolverSimplify(xSAT_Solver_t *)");
  }
  uVar5 = xSAT_SolverPropagate(s);
  iVar9 = 0;
  if (uVar5 == 0xffffffff) {
    iVar9 = 1;
    if ((s->nAssignSimplify != s->vTrail->nSize) && (s->nPropSimplify < 1)) {
      iVar9 = 0;
      for (i_00 = 0; p = s->vClauses, i_00 < p->nSize; i_00 = i_00 + 1) {
        uVar5 = Vec_IntEntry(p,i_00);
        if (uVar5 == 0xffffffff) {
          puVar8 = (uint *)0x0;
        }
        else {
          puVar8 = s->pMemory->pData + (int)uVar5;
        }
        lVar7 = 0;
        do {
          if ((int)puVar8[1] <= lVar7) {
            Vec_IntWriteEntry(s->vClauses,iVar9,uVar5);
            iVar9 = iVar9 + 1;
            goto LAB_00466e3b;
          }
          cVar4 = Vec_StrEntry(s->vAssigns,(int)puVar8[lVar7 + 2] >> 1);
          lVar3 = lVar7 + 2;
          lVar7 = lVar7 + 1;
        } while ((puVar8[lVar3] & 1) != (int)cVar4);
        *(byte *)puVar8 = (byte)*puVar8 | 2;
        uVar2 = puVar8[1];
        piVar1 = &(s->Stats).nClauseLits;
        *piVar1 = *piVar1 - (long)(int)uVar2;
        if ((long)(int)uVar2 == 2) {
          pxVar6 = xSAT_VecWatchListEntry(s->vBinWatches,puVar8[2] ^ 1);
          xSAT_WatchListRemove(pxVar6,uVar5);
          v = s->vBinWatches;
        }
        else {
          pxVar6 = xSAT_VecWatchListEntry(s->vWatches,puVar8[2] ^ 1);
          xSAT_WatchListRemove(pxVar6,uVar5);
          v = s->vWatches;
        }
        pxVar6 = xSAT_VecWatchListEntry(v,puVar8[3] ^ 1);
        xSAT_WatchListRemove(pxVar6,uVar5);
LAB_00466e3b:
      }
      Vec_IntShrink(p,iVar9);
      xSAT_SolverRebuildOrderHeap(s);
      lVar7 = (s->Stats).nLearntLits;
      s->nAssignSimplify = s->vTrail->nSize;
      s->nPropSimplify = lVar7 + (s->Stats).nClauseLits;
      iVar9 = 1;
    }
  }
  return iVar9;
}

Assistant:

int xSAT_SolverSimplify( xSAT_Solver_t * s )
{
    int i, j;
    unsigned CRef;
    assert( xSAT_SolverDecisionLevel(s) == 0 );

    if ( xSAT_SolverPropagate(s) != CRefUndef )
        return false;

    if ( s->nAssignSimplify == Vec_IntSize( s->vTrail ) || s->nPropSimplify > 0 )
        return true;

    j = 0;
    Vec_IntForEachEntry( s->vClauses, CRef, i )
    {
        xSAT_Clause_t * pCla = xSAT_SolverReadClause( s, CRef );
        if ( xSAT_SolverIsClauseSatisfied( s, pCla ) )
        {
            pCla->fMark = 1;
            s->Stats.nClauseLits -= pCla->nSize;

            if ( pCla->nSize == 2 )
            {
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit(pCla->pData[0].Lit) ), CRef );
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vBinWatches, xSAT_NegLit(pCla->pData[1].Lit) ), CRef );
            }
            else
            {
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit(pCla->pData[0].Lit) ), CRef );
                xSAT_WatchListRemove( xSAT_VecWatchListEntry( s->vWatches, xSAT_NegLit(pCla->pData[1].Lit) ), CRef );
            }
        }
        else
            Vec_IntWriteEntry( s->vClauses, j++, CRef );
    }
    Vec_IntShrink( s->vClauses, j );
    xSAT_SolverRebuildOrderHeap( s );

    s->nAssignSimplify = Vec_IntSize( s->vTrail );
    s->nPropSimplify = s->Stats.nClauseLits + s->Stats.nLearntLits;

    return true;
}